

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Collision_PDU::Collision_PDU
          (Collision_PDU *this,EntityIdentifier *IssuingID,EntityIdentifier *CollidingID,
          EntityIdentifier *EventID,CollisionType CT,Vector *Velocity,KFLOAT32 Mass,Vector *Location
          )

{
  KUINT16 KVar1;
  KFLOAT32 KVar2;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Collision_PDU_00227d58;
  (this->m_IssuingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00221e78;
  KVar1 = (IssuingID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_IssuingEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (IssuingID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_IssuingEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_IssuingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00221d18;
  *(undefined2 *)&(this->m_IssuingEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(IssuingID->super_SimulationIdentifier).field_0xc;
  (this->m_CollidingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00221e78;
  KVar1 = (CollidingID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_CollidingEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (CollidingID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_CollidingEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_CollidingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00221d18;
  *(undefined2 *)&(this->m_CollidingEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(CollidingID->super_SimulationIdentifier).field_0xc;
  (this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00221e78;
  KVar1 = (EventID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_EventID).super_SimulationIdentifier.m_ui16SiteID =
       (EventID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_EventID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00221d18;
  *(undefined2 *)&(this->m_EventID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(EventID->super_SimulationIdentifier).field_0xc;
  this->m_ui8CollisionType = (KUINT8)CT;
  this->m_ui8Padding = '\0';
  (this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00221f28;
  KVar2 = Velocity->m_f32Y;
  (this->m_Velocity).m_f32X = Velocity->m_f32X;
  (this->m_Velocity).m_f32Y = KVar2;
  (this->m_Velocity).m_f32Z = Velocity->m_f32Z;
  this->m_f32Mass = Mass;
  (this->m_Location).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00221f28;
  KVar2 = Location->m_f32Y;
  (this->m_Location).m_f32X = Location->m_f32X;
  (this->m_Location).m_f32Y = KVar2;
  (this->m_Location).m_f32Z = Location->m_f32Z;
  (this->super_Header).super_Header6.m_ui8PDUType = '\x04';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x01';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x3c;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Collision_PDU::Collision_PDU( const EntityIdentifier & IssuingID, const EntityIdentifier & CollidingID,
                              const EntityIdentifier & EventID, CollisionType CT,const Vector & Velocity,
                              KFLOAT32 Mass, const Vector & Location ) :
    m_IssuingEntityID( IssuingID ),
    m_CollidingEntityID( CollidingID ),
    m_EventID( EventID ),
    m_ui8CollisionType( CT ),
    m_ui8Padding( 0 ),
    m_Velocity( Velocity ),
    m_f32Mass( Mass ),
    m_Location( Location )
{
    m_ui8ProtocolFamily = Entity_Information_Interaction;
    m_ui8PDUType = Collision_PDU_Type;
    m_ui16PDULength = COLLISION_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}